

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_merge_pass.cpp
# Opt level: O2

bool __thiscall spvtools::opt::BlockMergePass::MergeBlocks(BlockMergePass *this,Function *func)

{
  bool bVar1;
  bool bVar2;
  UnderlyingIterator in_R8;
  pointer *ppuVar3;
  iterator bi;
  
  ppuVar3 = (pointer *)
            (func->blocks_).
            super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  bVar2 = false;
LAB_0048760a:
  do {
    if ((UptrVector *)ppuVar3 ==
        (UptrVector *)
        (func->blocks_).
        super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return bVar2;
    }
    bVar1 = IRContext::IsReachable((this->super_Pass).context_,(BasicBlock *)*ppuVar3);
    if (bVar1) {
      bVar1 = blockmergeutil::CanMergeWithSuccessor
                        ((this->super_Pass).context_,(BasicBlock *)*ppuVar3);
      if (bVar1) {
        bi.iterator_._M_current = in_R8._M_current;
        bi.container_ = (UptrVector *)ppuVar3;
        blockmergeutil::MergeWithSuccessor
                  ((blockmergeutil *)(this->super_Pass).context_,(IRContext *)func,
                   (Function *)&func->blocks_,bi);
        bVar2 = true;
        goto LAB_0048760a;
      }
    }
    ppuVar3 = ppuVar3 + 1;
  } while( true );
}

Assistant:

bool BlockMergePass::MergeBlocks(Function* func) {
  bool modified = false;
  for (auto bi = func->begin(); bi != func->end();) {
    // Don't bother trying to merge unreachable blocks.
    if (context()->IsReachable(*bi) &&
        blockmergeutil::CanMergeWithSuccessor(context(), &*bi)) {
      blockmergeutil::MergeWithSuccessor(context(), func, bi);
      // Reprocess block.
      modified = true;
    } else {
      ++bi;
    }
  }
  return modified;
}